

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_streams.cpp
# Opt level: O0

void __thiscall despot::RandomStreams::RandomStreams(RandomStreams *this,int num_streams,int length)

{
  reference pvVar1;
  reference pvVar2;
  reference pvVar3;
  double dVar4;
  int local_48;
  Random local_44;
  int j;
  Random random;
  int i;
  undefined1 local_30 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> seeds;
  int length_local;
  int num_streams_local;
  RandomStreams *this_local;
  
  seeds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = length;
  seeds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = num_streams;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->streams_);
  this->position_ = 0;
  Seeds::Next((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,
              seeds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->streams_,
           (long)seeds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_);
  for (j = 0; j < seeds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_; j = j + 1) {
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,(long)j);
    Random::Random(&local_44,*pvVar1);
    pvVar2 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->streams_,(long)j);
    std::vector<double,_std::allocator<double>_>::resize
              (pvVar2,(long)(int)seeds.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
    for (local_48 = 0;
        local_48 <
        (int)seeds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage; local_48 = local_48 + 1) {
      dVar4 = Random::NextDouble(&local_44);
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->streams_,(long)j);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(long)local_48);
      *pvVar3 = dVar4;
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  return;
}

Assistant:

RandomStreams::RandomStreams(int num_streams, int length) :
	position_(0) {
	vector<unsigned> seeds = Seeds::Next(num_streams);

	streams_.resize(num_streams);
	for (int i = 0; i < num_streams; i++) {
		Random random(seeds[i]);
		streams_[i].resize(length);
		for (int j = 0; j < length; j++)
			streams_[i][j] = random.NextDouble();
	}
}